

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst-epoll.c
# Opt level: O1

void * t1_func(void *arg)

{
  int __fd;
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  undefined8 uVar4;
  char *pcVar5;
  char c;
  epoll_event events [1024];
  undefined1 local_3019;
  epoll_event local_3018 [768];
  
  iVar2 = *arg;
  __fd = *(int *)((long)arg + 4);
  iVar1 = epoll_wait(iVar2,local_3018,0x400,5000);
  if (((iVar1 == 1) && (((byte)local_3018[0].events & 1) != 0)) && (local_3018[0]._4_4_ == 0x7b)) {
    sVar3 = read(__fd,&local_3019,1);
    if ((int)sVar3 == 1) {
      iVar2 = epoll_wait(iVar2,local_3018,0x400,0);
      if (iVar2 == 0) {
        return (void *)0x0;
      }
      pcVar5 = "%s:%d: epoll after read";
      uVar4 = 0xda;
    }
    else {
      pcVar5 = "%s:%d: read after poll";
      uVar4 = 0xd7;
    }
  }
  else {
    pcVar5 = "%s:%d: epoll_wait in thread";
    uVar4 = 0xd3;
  }
  microatf_fail_require
            (pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-epoll.c"
             ,uVar4);
}

Assistant:

static void *
t1_func(void *arg)
{
	struct t1_args *t1_args = arg;
	int ep = t1_args->ep;
	int s_0 = t1_args->s_0;
	struct epoll_event events[MAXEVENTS];
	int r;

	int r2 = epoll_wait(ep, events, MAXEVENTS, 5000);
	ATF_REQUIRE_MSG(r2 == 1 && (events[0].events & EPOLLIN) &&
		(events[0].data.u32 == 123),
	    "epoll_wait in thread");

	char c;
	r2 = (int)read(s_0, &c, 1);
	ATF_REQUIRE_MSG(r2 == 1, "read after poll");

	r = epoll_wait(ep, events, MAXEVENTS, 0);
	ATF_REQUIRE_MSG(r == 0, "epoll after read");

	return NULL;
}